

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O1

Maybe<unsigned_long> __thiscall
kj::TreeIndex<kj::TreeMap<capnp::Text::Reader,unsigned_int>::Callbacks>::
insert<kj::TreeMap<capnp::Text::Reader,unsigned_int>::Entry,capnp::Text::Reader&>
          (TreeIndex<kj::TreeMap<capnp::Text::Reader,unsigned_int>::Callbacks> *this,
          ArrayPtr<kj::TreeMap<capnp::Text::Reader,_unsigned_int>::Entry> table,size_t pos,
          Reader *params)

{
  int iVar1;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX_00;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 __n;
  undefined8 *in_R9;
  ulong uVar2;
  ulong uVar3;
  Maybe<unsigned_long> MVar4;
  Iterator iter;
  Iterator local_70;
  size_t local_58;
  size_t local_50;
  SearchKey local_48;
  Entry *local_40;
  size_t *local_38;
  
  local_58 = table.size_;
  local_40 = table.ptr;
  local_38 = &local_58;
  local_48._vptr_SearchKey = (_func_int **)&PTR_search_001c2e68;
  local_50 = pos;
  _::BTreeImpl::insert
            (&local_70,(BTreeImpl *)&(local_40->key).super_StringPtr.content.size_,&local_48);
  uVar2 = (ulong)local_70.row;
  if ((uVar2 != 0xe) && ((local_70.leaf)->rows[uVar2].i != 0)) {
    uVar3 = (ulong)((local_70.leaf)->rows[uVar2].i - 1);
    __n = (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2)
          ((anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *)
          (local_58 + 8 + uVar3 * 0x18))->value;
    if (__n.value == in_R9[1]) {
      if (__n.value != 0) {
        iVar1 = bcmp(*(void **)(local_58 + uVar3 * 0x18),(void *)*in_R9,__n.value);
        __n = extraout_RDX;
        if (iVar1 != 0) goto LAB_00145710;
      }
      *this = (TreeIndex<kj::TreeMap<capnp::Text::Reader,unsigned_int>::Callbacks>)0x1;
      *(ulong *)(this + 8) = uVar3;
      goto LAB_00145746;
    }
  }
LAB_00145710:
  memmove((local_70.leaf)->rows + uVar2 + 1,(local_70.leaf)->rows + uVar2,
          (ulong)(local_70.row + 1) * -4 + 0x38);
  (local_70.leaf)->rows[uVar2].i = (int)params + 1;
  *this = (TreeIndex<kj::TreeMap<capnp::Text::Reader,unsigned_int>::Callbacks>)0x0;
  __n = extraout_RDX_00;
LAB_00145746:
  MVar4.ptr.field_1.value = __n.value;
  MVar4.ptr._0_8_ = this;
  return (Maybe<unsigned_long>)MVar4.ptr;
}

Assistant:

kj::Maybe<size_t> insert(kj::ArrayPtr<Row> table, size_t pos, Params&&... params) {
    auto iter = impl.insert(searchKey(table, params...));

    if (!iter.isEnd() && cb.matches(table[*iter], params...)) {
      return *iter;
    } else {
      iter.insert(impl, pos);
      return kj::none;
    }
  }